

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

int __thiscall sf::Image::copy(Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int in_ECX;
  pointer __dest;
  int i;
  int iVar7;
  ulong uVar8;
  int *in_R8;
  char in_R9B;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  void *__src;
  uint uVar14;
  
  uVar5 = *(uint *)dst;
  if (uVar5 != 0) {
    iVar7 = *(int *)(dst + 4);
    uVar2 = (this->m_size).x;
    if ((uVar2 != 0 && iVar7 != 0) && (uVar9 = (this->m_size).y, uVar9 != 0)) {
      uVar12 = in_R8[2];
      iVar3 = in_R8[3];
      iVar10 = 0;
      if (iVar3 == 0 || uVar12 == 0) {
        iVar13 = 0;
        uVar12 = uVar5;
      }
      else {
        iVar10 = *in_R8;
        if (*in_R8 < 1) {
          iVar10 = 0;
        }
        iVar13 = 0;
        if (0 < in_R8[1]) {
          iVar13 = in_R8[1];
        }
        if ((int)uVar5 <= (int)uVar12) {
          uVar12 = uVar5;
        }
        if (iVar3 < iVar7) {
          iVar7 = iVar3;
        }
      }
      iVar3 = (int)src;
      uVar14 = uVar2 - iVar3;
      if (iVar3 + uVar12 <= uVar2) {
        uVar14 = uVar12;
      }
      iVar4 = uVar9 - in_ECX;
      if ((uint)(iVar7 + in_ECX) <= uVar9) {
        iVar4 = iVar7;
      }
      if ((0 < (int)uVar14) && (0 < iVar4)) {
        iVar13 = iVar13 * uVar5;
        uVar5 = uVar5 << 2;
        __src = (void *)((ulong)(uint)((iVar13 + iVar10) * 4) + *(long *)(dst + 8));
        __dest = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (in_ECX * uVar2 + iVar3) * 4;
        if (in_R9B == '\0') {
          lVar11 = (long)(int)uVar5;
          iVar7 = 0;
          do {
            pvVar6 = memcpy(__dest,__src,(ulong)(uVar14 << 2));
            uVar5 = (uint)pvVar6;
            __src = (void *)((long)__src + lVar11);
            __dest = __dest + (int)(uVar2 * 4);
            iVar7 = iVar7 + 1;
          } while (iVar7 < iVar4);
        }
        else {
          iVar7 = 0;
          do {
            uVar8 = 0;
            do {
              bVar1 = *(byte *)((long)__src + uVar8 * 4 + 3);
              uVar9 = bVar1 ^ 0xff;
              __dest[uVar8 * 4] =
                   (uchar)((ulong)(__dest[uVar8 * 4] * uVar9 +
                                  (uint)*(byte *)((long)__src + uVar8 * 4) * (uint)bVar1) *
                           0x1010102 >> 0x20);
              __dest[uVar8 * 4 + 1] =
                   (uchar)((ulong)(__dest[uVar8 * 4 + 1] * uVar9 +
                                  (uint)*(byte *)((long)__src + uVar8 * 4 + 1) * (uint)bVar1) *
                           0x1010102 >> 0x20);
              __dest[uVar8 * 4 + 2] =
                   (uchar)((ulong)(__dest[uVar8 * 4 + 2] * uVar9 +
                                  (uint)*(byte *)((long)__src + uVar8 * 4 + 2) * (uint)bVar1) *
                           0x1010102 >> 0x20);
              __dest[uVar8 * 4 + 3] = (char)((__dest[uVar8 * 4 + 3] * uVar9) / 0xff) + bVar1;
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar14);
            __src = (void *)((long)__src + (long)(int)uVar5);
            __dest = __dest + (int)(uVar2 * 4);
            iVar7 = iVar7 + 1;
          } while (iVar7 < iVar4);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

void Image::copy(const Image& source, unsigned int destX, unsigned int destY, const IntRect& sourceRect, bool applyAlpha)
{
    // Make sure that both images are valid
    if ((source.m_size.x == 0) || (source.m_size.y == 0) || (m_size.x == 0) || (m_size.y == 0))
        return;

    // Adjust the source rectangle
    IntRect srcRect = sourceRect;
    if (srcRect.width == 0 || (srcRect.height == 0))
    {
        srcRect.left   = 0;
        srcRect.top    = 0;
        srcRect.width  = source.m_size.x;
        srcRect.height = source.m_size.y;
    }
    else
    {
        if (srcRect.left   < 0) srcRect.left = 0;
        if (srcRect.top    < 0) srcRect.top  = 0;
        if (srcRect.width  > static_cast<int>(source.m_size.x)) srcRect.width  = source.m_size.x;
        if (srcRect.height > static_cast<int>(source.m_size.y)) srcRect.height = source.m_size.y;
    }

    // Then find the valid bounds of the destination rectangle
    int width  = srcRect.width;
    int height = srcRect.height;
    if (destX + width  > m_size.x) width  = m_size.x - destX;
    if (destY + height > m_size.y) height = m_size.y - destY;

    // Make sure the destination area is valid
    if ((width <= 0) || (height <= 0))
        return;

    // Precompute as much as possible
    int          pitch     = width * 4;
    int          rows      = height;
    int          srcStride = source.m_size.x * 4;
    int          dstStride = m_size.x * 4;
    const Uint8* srcPixels = &source.m_pixels[0] + (srcRect.left + srcRect.top * source.m_size.x) * 4;
    Uint8*       dstPixels = &m_pixels[0] + (destX + destY * m_size.x) * 4;

    // Copy the pixels
    if (applyAlpha)
    {
        // Interpolation using alpha values, pixel by pixel (slower)
        for (int i = 0; i < rows; ++i)
        {
            for (int j = 0; j < width; ++j)
            {
                // Get a direct pointer to the components of the current pixel
                const Uint8* src = srcPixels + j * 4;
                Uint8*       dst = dstPixels + j * 4;

                // Interpolate RGBA components using the alpha value of the source pixel
                Uint8 alpha = src[3];
                dst[0] = (src[0] * alpha + dst[0] * (255 - alpha)) / 255;
                dst[1] = (src[1] * alpha + dst[1] * (255 - alpha)) / 255;
                dst[2] = (src[2] * alpha + dst[2] * (255 - alpha)) / 255;
                dst[3] = alpha + dst[3] * (255 - alpha) / 255;
            }

            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
    else
    {
        // Optimized copy ignoring alpha values, row by row (faster)
        for (int i = 0; i < rows; ++i)
        {
            std::memcpy(dstPixels, srcPixels, pitch);
            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
}